

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_clear(archive_entry *entry)

{
  archive_entry *in_RDI;
  void *in_stack_ffffffffffffffe8;
  archive_entry *local_8;
  
  if (in_RDI == (archive_entry *)0x0) {
    local_8 = (archive_entry *)0x0;
  }
  else {
    archive_mstring_clean((archive_mstring *)0x11c130);
    archive_mstring_clean((archive_mstring *)0x11c141);
    archive_mstring_clean((archive_mstring *)0x11c152);
    archive_mstring_clean((archive_mstring *)0x11c163);
    archive_mstring_clean((archive_mstring *)0x11c174);
    archive_mstring_clean((archive_mstring *)0x11c185);
    archive_mstring_clean((archive_mstring *)0x11c196);
    archive_entry_copy_mac_metadata(in_RDI,in_stack_ffffffffffffffe8,0x11c1a7);
    archive_acl_clear((archive_acl *)in_RDI);
    archive_entry_xattr_clear(in_RDI);
    archive_entry_sparse_clear(in_RDI);
    free(in_RDI->stat);
    memset(in_RDI,0,0x438);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

struct archive_entry *
archive_entry_clear(struct archive_entry *entry)
{
	if (entry == NULL)
		return (NULL);
	archive_mstring_clean(&entry->ae_fflags_text);
	archive_mstring_clean(&entry->ae_gname);
	archive_mstring_clean(&entry->ae_hardlink);
	archive_mstring_clean(&entry->ae_pathname);
	archive_mstring_clean(&entry->ae_sourcepath);
	archive_mstring_clean(&entry->ae_symlink);
	archive_mstring_clean(&entry->ae_uname);
	archive_entry_copy_mac_metadata(entry, NULL, 0);
	archive_acl_clear(&entry->acl);
	archive_entry_xattr_clear(entry);
	archive_entry_sparse_clear(entry);
	free(entry->stat);
	memset(entry, 0, sizeof(*entry));
	return entry;
}